

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_err.cpp
# Opt level: O2

void WarningImpl(char *id,char *message,char *badValueMessage,EWStatus type)

{
  size_t sVar1;
  size_t sVar2;
  char *__src;
  EStatus EStack_30;
  
  if (DAT_0018a515 == '\x01') {
    switch(type) {
    case W_ALL:
      EStack_30 = ALL;
      break;
    case W_EARLY:
      EStack_30 = EARLY;
      break;
    case W_PASS3:
      EStack_30 = PASS3;
      break;
    case W_PASS03:
      EStack_30 = PASS03;
      break;
    default:
      goto switchD_001139e4_default;
    }
    Error(message,badValueMessage,EStack_30);
    return;
  }
switchD_001139e4_default:
  WarningCount = WarningCount + 1;
  CDefineTable::Replace(&DefineTable,"__WARNINGS__",WarningCount);
  initErrorLine();
  sVar1 = strlen(ErrorLine);
  sVar2 = strlen(ErrorLine);
  if (id == (char *)0x0) {
    builtin_strncpy(ErrorLine + sVar2,"warning:",8);
    (ErrorLine + sVar2 + 8)[0] = ' ';
    (ErrorLine + sVar2 + 8)[1] = '\0';
  }
  else {
    builtin_strncpy(ErrorLine + sVar2,"warning[",8);
    ErrorLine[sVar2 + 8] = '\0';
    strncat(ErrorLine,id,0xfff);
    sVar2 = strlen(ErrorLine);
    builtin_strncpy(ErrorLine + sVar2,"]: ",4);
  }
  if (extraErrorWarningPrefix != (char *)0x0) {
    strncat(ErrorLine,extraErrorWarningPrefix,0xfff);
  }
  __src = "<nullptr>";
  if (message != (char *)0x0) {
    __src = message;
  }
  strncat(ErrorLine,__src,0xfff);
  if (badValueMessage != (char *)0x0) {
    sVar2 = strlen(ErrorLine);
    (ErrorLine + sVar2)[0] = ':';
    (ErrorLine + sVar2)[1] = ' ';
    ErrorLine[sVar2 + 2] = '\0';
    strncat(ErrorLine,badValueMessage,0xfff);
  }
  outputErrorLine(OV_WARNING,(int)sVar1,7);
  return;
}

Assistant:

static void WarningImpl(const char* id, const char* message, const char* badValueMessage, EWStatus type) {
	// turn the warning into error if "Warnings as errors" is switched on
	if (Options::syx.WarningsAsErrors) switch (type) {
		case W_EARLY:	Error(message, badValueMessage, EARLY); return;
		case W_PASS3:	Error(message, badValueMessage, PASS3); return;
		case W_PASS03:	Error(message, badValueMessage, PASS03); return;
		case W_ALL:		Error(message, badValueMessage, ALL); return;
	}

	++WarningCount;
	DefineTable.Replace("__WARNINGS__", WarningCount);

	initErrorLine();
	const int warningTxtPos = strlen(ErrorLine);
	if (id) {
		STRCAT(ErrorLine, LINEMAX2-1, "warning[");
		STRCAT(ErrorLine, LINEMAX2-1, id);
		STRCAT(ErrorLine, LINEMAX2-1, "]: ");
	} else {
		STRCAT(ErrorLine, LINEMAX2-1, "warning: ");
	}
	if (extraErrorWarningPrefix) STRCAT(ErrorLine, LINEMAX2-1, extraErrorWarningPrefix);
	STRCAT(ErrorLine, LINEMAX2-1, message ? message : nullptr_message_txt);
	if (badValueMessage) {
		STRCAT(ErrorLine, LINEMAX2-1, ": "); STRCAT(ErrorLine, LINEMAX2-1, badValueMessage);
	}
	outputErrorLine(OV_WARNING, warningTxtPos, 7);
}